

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O0

GLenum gl4cts::CopyImage::Utils::transProxyToRealTarget(GLenum target)

{
  undefined4 local_c;
  GLenum target_local;
  
  if (target == 0x8063) {
    local_c = 0xde0;
  }
  else if (target == 0x8064) {
    local_c = 0xde1;
  }
  else if (target == 0x8070) {
    local_c = 0x806f;
  }
  else if (target == 0x84f7) {
    local_c = 0x84f5;
  }
  else if (target == 0x851b) {
    local_c = 0x8513;
  }
  else if (target == 0x8c19) {
    local_c = 0x8c18;
  }
  else if (target == 0x8c1b) {
    local_c = 0x8c1a;
  }
  else if (target == 0x900b) {
    local_c = 0x9009;
  }
  else if (target == 0x9101) {
    local_c = 0x9100;
  }
  else {
    local_c = target;
    if (target == 0x9103) {
      local_c = 0x9102;
    }
  }
  return local_c;
}

Assistant:

GLenum Utils::transProxyToRealTarget(GLenum target)
{
	switch (target)
	{
	case GL_PROXY_TEXTURE_1D:
		target = GL_TEXTURE_1D;
		break;
	case GL_PROXY_TEXTURE_1D_ARRAY:
		target = GL_TEXTURE_1D_ARRAY;
		break;
	case GL_PROXY_TEXTURE_2D:
		target = GL_TEXTURE_2D;
		break;
	case GL_PROXY_TEXTURE_2D_ARRAY:
		target = GL_TEXTURE_2D_ARRAY;
		break;
	case GL_PROXY_TEXTURE_2D_MULTISAMPLE:
		target = GL_TEXTURE_2D_MULTISAMPLE;
		break;
	case GL_PROXY_TEXTURE_2D_MULTISAMPLE_ARRAY:
		target = GL_TEXTURE_2D_MULTISAMPLE_ARRAY;
		break;
	case GL_PROXY_TEXTURE_3D:
		target = GL_TEXTURE_3D;
		break;
	case GL_PROXY_TEXTURE_CUBE_MAP:
		target = GL_TEXTURE_CUBE_MAP;
		break;
	case GL_PROXY_TEXTURE_CUBE_MAP_ARRAY:
		target = GL_TEXTURE_CUBE_MAP_ARRAY;
		break;
	case GL_PROXY_TEXTURE_RECTANGLE:
		target = GL_TEXTURE_RECTANGLE;
		break;
	default:
		break;
	}

	return target;
}